

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetRoll(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int iVar1;
  VMValue *pVVar2;
  AActor *this;
  bool bVar3;
  bool local_5b;
  TAngle<double> local_58;
  AActor *local_50;
  AActor *ref;
  int ptr;
  int flags;
  double roll;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x128d,
                  "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x128d,
                  "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  roll = (param->field_0).f;
  local_5b = true;
  if ((DObject *)roll != (DObject *)0x0) {
    local_5b = DObject::IsKindOf((DObject *)roll,AActor::RegistrationInfo.MyClass);
  }
  if (local_5b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x128d,
                  "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  iVar1 = (int)self + 1;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x128e,
                  "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x128e,
                  "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  _ptr = defaultparam_local[iVar1].Array;
  self._0_4_ = (int)self + 2;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x128f,
                    "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    ref._4_4_ = *(uint *)&defaultparam_local[(int)self].Array;
  }
  else {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x128f,
                    "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
    ref._4_4_ = (pVVar2->field_0).i;
  }
  self._0_4_ = (int)self + 1;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1290,
                    "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    ref._0_4_ = *(int *)&defaultparam_local[(int)self].Array;
  }
  else {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1290,
                    "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
    ref._0_4_ = (pVVar2->field_0).i;
  }
  this = COPY_AAPTR((AActor *)roll,(int)ref);
  if (this != (AActor *)0x0) {
    local_50 = this;
    TAngle<double>::TAngle(&local_58,(double)_ptr);
    AActor::SetRoll(this,&local_58,(ref._4_4_ & 2) != 0);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetRoll)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT		(roll);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(ptr)	;
	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref != NULL)
	{
		ref->SetRoll(roll, !!(flags & SPF_INTERPOLATE));
	}
	return 0;
}